

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall
PDFObjectParser::ParseHexadecimalString(PDFObjectParser *this,string *inToken)

{
  char *pcVar1;
  PDFHexString *this_00;
  Trace *this_01;
  string local_78;
  string local_58;
  string local_38;
  
  pcVar1 = (char *)std::__cxx11::string::at((ulong)inToken);
  if (*pcVar1 == '>') {
    this_00 = (PDFHexString *)operator_new(0x68);
    std::__cxx11::string::substr((ulong)&local_58,(ulong)inToken);
    DecodeHexString(&local_38,this,&local_58);
    MaybeDecryptString(&local_78,this,&local_38);
    PDFHexString::PDFHexString(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    this_01 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)&local_78,(ulong)inToken);
    Trace::TraceToLog(this_01,
                      "PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s"
                      ,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = (PDFHexString *)0x0;
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseHexadecimalString(const std::string& inToken)
{
	// verify that last character is '>'
	if(inToken.at(inToken.size()-1) != scRightAngle)
	{
		TRACE_LOG1("PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	return new PDFHexString(MaybeDecryptString(DecodeHexString(inToken.substr(1, inToken.size() - 2))));
}